

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  PmaReader *pPVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMerger->pTask = pTask;
  iVar10 = pMerger->nTree;
  lVar4 = (long)iVar10;
  if (0 < lVar4) {
    lVar9 = 0;
    do {
      iVar10 = iVar10 + -1;
      if (eMode == 2) {
        uVar2 = vdbePmaReaderNext(pMerger->aReadr + iVar10);
      }
      else {
        uVar2 = vdbePmaReaderIncrInit((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar9),0);
      }
      if (uVar2 != 0) goto LAB_0015a16c;
      lVar9 = lVar9 + 0x50;
    } while (lVar4 * 0x50 != lVar9);
    iVar10 = pMerger->nTree;
    if (1 < (long)iVar10) {
      iVar6 = iVar10 * 2;
      uVar7 = (long)iVar10 + 1;
      do {
        iVar6 = iVar6 + -2;
        uVar8 = uVar7 - 1;
        iVar10 = pMerger->nTree / 2;
        if ((long)iVar10 < (long)uVar8) {
          iVar5 = iVar6 + iVar10 * -2;
          iVar10 = iVar5 + 1;
        }
        else {
          iVar5 = pMerger->aTree[uVar7 * 2 + -4];
          iVar10 = pMerger->aTree[uVar7 * 2 + -3];
        }
        pPVar1 = pMerger->aReadr;
        iVar11 = iVar10;
        if ((pPVar1[iVar5].pFd != (sqlite3_file *)0x0) &&
           (iVar11 = iVar5, pPVar1[iVar10].pFd != (sqlite3_file *)0x0)) {
          local_3c = 0;
          iVar3 = (*pMerger->pTask->xCompare)
                            (pMerger->pTask,&local_3c,pPVar1[iVar5].aKey,pPVar1[iVar5].nKey,
                             pPVar1[iVar10].aKey,pPVar1[iVar10].nKey);
          iVar11 = iVar10;
          if (iVar3 < 1) {
            iVar11 = iVar5;
          }
        }
        pMerger->aTree[uVar7 - 2] = iVar11;
        uVar7 = uVar8;
      } while (2 < uVar8);
    }
  }
  uVar2 = (uint)pTask->pUnpacked->errCode;
LAB_0015a16c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree;                      /* Number of subtrees to merge */

  /* Failure to allocate the merge would have been detected prior to
  ** invoking this routine */
  assert( pMerger!=0 );

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  nTree = pMerger->nTree;
  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}